

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O3

TestPackageRegistry * tcu::TestPackageRegistry::getSingleton(void)

{
  if (getOrDestroy::s_ptr != (TestPackageRegistry *)0x0) {
    return getOrDestroy::s_ptr;
  }
  getOrDestroy::s_ptr = (TestPackageRegistry *)operator_new(0x18);
  (getOrDestroy::s_ptr->m_packageInfos).
  super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (getOrDestroy::s_ptr->m_packageInfos).
  super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (getOrDestroy::s_ptr->m_packageInfos).
  super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return getOrDestroy::s_ptr;
}

Assistant:

TestPackageRegistry* TestPackageRegistry::getOrDestroy (bool isCreate)
{
	static TestPackageRegistry* s_ptr = DE_NULL;

	if (isCreate)
	{
		if (!s_ptr)
			s_ptr = new TestPackageRegistry();

		return s_ptr;
	}
	else
	{
		if (s_ptr)
		{
			delete s_ptr;
			s_ptr = DE_NULL;
		}

		return DE_NULL;
	}
}